

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_RepeatedFieldSmartSetTest_IdenticalElements_Test::
~MessageDifferencerTest_RepeatedFieldSmartSetTest_IdenticalElements_Test
          (MessageDifferencerTest_RepeatedFieldSmartSetTest_IdenticalElements_Test *this)

{
  MessageDifferencerTest_RepeatedFieldSmartSetTest_IdenticalElements_Test *this_local;
  
  ~MessageDifferencerTest_RepeatedFieldSmartSetTest_IdenticalElements_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldSmartSetTest_IdenticalElements) {
  // Create the testing protos
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  proto2_unittest::TestField elem;

  elem.set_a(1);
  elem.set_b(1);
  elem.set_c(1);

  *msg1.add_rm() = elem;
  *msg1.add_rm() = elem;
  *msg2.add_rm() = elem;
  *msg2.add_rm() = elem;

  util::MessageDifferencer differencer;
  differencer.set_repeated_field_comparison(
      util::MessageDifferencer::AS_SMART_SET);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));
}